

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O3

void resize_GL(SWindowData *window_data)

{
  undefined8 *puVar1;
  
  if (window_data->is_initialized == true) {
    puVar1 = (undefined8 *)window_data->specific;
    glXMakeCurrent(puVar1[1],*puVar1,puVar1[4]);
    glViewport(0,0,window_data->window_width,window_data->window_height);
    glMatrixMode(0x1701);
    glLoadIdentity();
    glOrtho(0,(double)window_data->window_width,(double)window_data->window_height,0,
            0x40a0000000000000,0xc0a0000000000000);
    glClear(0x4000);
    return;
  }
  return;
}

Assistant:

void
resize_GL(SWindowData *window_data) {
    if (window_data->is_initialized) {
    #if defined(_WIN32) || defined(WIN32)

        SWindowData_Win *window_data_ex = (SWindowData_Win *) window_data->specific;
        wglMakeCurrent(window_data_ex->hdc, window_data_ex->hGLRC);

    #elif defined(linux)

        SWindowData_X11 *window_data_ex = (SWindowData_X11 *) window_data->specific;
        glXMakeCurrent(window_data_ex->display, window_data_ex->window, window_data_ex->context);

    #endif

        glViewport(0, 0, window_data->window_width, window_data->window_height);

        glMatrixMode(GL_PROJECTION);
        glLoadIdentity();
        glOrtho(0, window_data->window_width, window_data->window_height, 0, 2048, -2048);

        glClear(GL_COLOR_BUFFER_BIT);
    }
}